

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O1

int cbs_close(CBS_HANDLE cbs)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (cbs == (CBS_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1b0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1b0;
    }
    pcVar4 = "NULL cbs handle";
    iVar3 = 0x1af;
  }
  else if (cbs->cbs_state == CBS_STATE_CLOSED) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1b7;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1b7;
    }
    pcVar4 = "Already closed";
    iVar3 = 0x1b6;
  }
  else {
    iVar1 = amqp_management_close(cbs->amqp_management);
    if (iVar1 == 0) {
      if (cbs->cbs_state == CBS_STATE_OPENING) {
        (*cbs->on_cbs_open_complete)(cbs->on_cbs_open_complete_context,CBS_OPEN_CANCELLED);
      }
      cbs->cbs_state = CBS_STATE_CLOSED;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1c0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1c0;
    }
    pcVar4 = "Failed closing AMQP management instance";
    iVar3 = 0x1bf;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/cbs.c"
            ,"cbs_close",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int cbs_close(CBS_HANDLE cbs)
{
    int result;

    if (cbs == NULL)
    {
        /* Codes_SRS_CBS_01_045: [ If the argument `cbs` is NULL, `cbs_close` shall fail and return a non-zero value. ]*/
        LogError("NULL cbs handle");
        result = MU_FAILURE;
    }
    else if (cbs->cbs_state == CBS_STATE_CLOSED)
    {
        /* Codes_SRS_CBS_01_047: [ `cbs_close` when closed shall fail and return a non-zero value. ]*/
        /* Codes_SRS_CBS_01_048: [ `cbs_close` when not opened shall fail and return a non-zero value. ]*/
        LogError("Already closed");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_CBS_01_044: [ `cbs_close` shall close the CBS instance by calling `amqp_management_close` on the underlying AMQP management handle. ]*/
        if (amqp_management_close(cbs->amqp_management) != 0)
        {
            /* Codes_SRS_CBS_01_046: [ If `amqp_management_close` fails, `cbs_close` shall fail and return a non-zero value. ]*/
            LogError("Failed closing AMQP management instance");
            result = MU_FAILURE;
        }
        else
        {
            if (cbs->cbs_state == CBS_STATE_OPENING)
            {
                /* Codes_SRS_CBS_01_079: [ If `cbs_close` is called while OPENING, the `on_cbs_open_complete` callback shall be called with `CBS_OPEN_CANCELLED`, while passing the `on_cbs_open_complete_context` as argument. ]*/
                cbs->on_cbs_open_complete(cbs->on_cbs_open_complete_context, CBS_OPEN_CANCELLED);
            }

            cbs->cbs_state = CBS_STATE_CLOSED;

            /* Codes_SRS_CBS_01_080: [ On success, `cbs_close` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}